

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

void __thiscall
ON_BinaryArchive::SetStorageDeviceError(ON_BinaryArchive *this,uint storage_device_error)

{
  if ((storage_device_error != 0) &&
     (Internal_ReportCriticalError(this), this->m_storage_device_error == 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x250,"","Damaged file and / or buggy code. Please investigate.");
    this->m_storage_device_error = storage_device_error;
  }
  return;
}

Assistant:

void ON_BinaryArchive::SetStorageDeviceError(
  unsigned int storage_device_error
  )
{
  if (0 != storage_device_error)
  {
    Internal_ReportCriticalError();

    // A critical error terminates the read/write.
    // The first one sets the code and subsequent attempts to modify
    // the code fail.
    if (0 == m_storage_device_error)
    {
      ON_ERROR("Damaged file and / or buggy code. Please investigate.");
      m_storage_device_error = storage_device_error;
    }
  }
}